

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::editor(Forth *this)

{
  value_type vVar1;
  size_type sVar2;
  reference pvVar3;
  Forth *this_local;
  
  sVar2 = std::vector<int,_std::allocator<int>_>::size(&this->searchOrder);
  if (sVar2 == 0) {
    std::vector<int,_std::allocator<int>_>::push_back(&this->searchOrder,&this->widForthEditor);
  }
  else {
    vVar1 = this->widForthEditor;
    sVar2 = std::vector<int,_std::allocator<int>_>::size(&this->searchOrder);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->searchOrder,sVar2 - 1);
    *pvVar3 = vVar1;
  }
  return;
}

Assistant:

void editor(){
			if(searchOrder.size()>0){
				searchOrder[searchOrder.size()-1]=widForthEditor;	
			}else {
				searchOrder.push_back(widForthEditor);
			}	
		}